

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::TestCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  BackgroundCommand *this_00;
  Output local_50;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  this_00 = (BackgroundCommand *)operator_new(0x50);
  this_00->engine = this->engine;
  this_00->_vptr_BackgroundCommand = (_func_int **)&PTR__TestCommandHandle_0015bc80;
  this_00[3]._vptr_BackgroundCommand = (_func_int **)(this_00 + 4);
  this_00[3].engine = (ChessEngine *)0x0;
  *(undefined1 *)&this_00[4]._vptr_BackgroundCommand = 0;
  sVar1 = DAT_001b07b8;
  if (((params == (char *)0x0) || (*params == '\0')) ||
     (((DAT_001b07b8 != 0 &&
       (iVar3 = strncmp(params,token::Help_abi_cxx11_,DAT_001b07b8), iVar3 == 0)) &&
      ((params[sVar1] == '\0' || (iVar3 = isspace((int)params[sVar1]), iVar3 != 0)))))) {
    Output::Output(&local_50,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    (*this_00->_vptr_BackgroundCommand[3])(&local_48,this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    Output::~Output(&local_50);
    Output::Output(&local_50,InfoPrefix);
    (*this_00->_vptr_BackgroundCommand[4])(&local_48,this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    Output::~Output(&local_50);
  }
  else {
    bVar2 = BackgroundCommand::ParseAndExecute(this_00,params,&this->thread);
    if (bVar2) {
      return;
    }
  }
  (*this_00->_vptr_BackgroundCommand[1])(this_00);
  return;
}

Assistant:

void UCIAdapter::TestCommand(const char* params)
{
  TestCommandHandle* handle = new TestCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}